

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O2

void Bbl_ManDumpBlif(Bbl_Man_t *p,char *pFileName)

{
  undefined1 *puVar1;
  Bbl_Obj_t *pBVar2;
  FILE *__s;
  Bbl_Obj_t *pBVar3;
  Bbl_Obj_t *pBVar4;
  Vec_Str_t *pVVar5;
  uint uVar6;
  char *__format;
  
  __s = fopen(pFileName,"w");
  fwrite("# Test file written by Bbl_ManDumpBlif() in ABC.\n",0x31,1,__s);
  fprintf(__s,".model %s\n",p->pName->pArray);
  pVVar5 = p->pObjs;
  pBVar3 = (Bbl_Obj_t *)pVVar5->pArray;
  pBVar4 = pBVar3;
  do {
    if (pBVar4 == (Bbl_Obj_t *)0x0) {
      while (pBVar3 != (Bbl_Obj_t *)0x0) {
        uVar6 = *(uint *)&pBVar3->field_0x8;
        if ((uVar6 & 2) != 0) {
          fwrite(".names",6,1,__s);
          if (*(uint *)&pBVar3->field_0x8 < 0x10) {
            pBVar4 = (Bbl_Obj_t *)0x0;
          }
          else {
            pBVar4 = (Bbl_Obj_t *)((long)pBVar3 - (long)pBVar3[1].Id);
          }
          for (; pBVar4 != (Bbl_Obj_t *)0x0; pBVar4 = Bbl_ObjFaninNext(pBVar3,pBVar4)) {
            fprintf(__s," %d",(ulong)(uint)pBVar4->Id);
          }
          fprintf(__s," %d\n",(ulong)(uint)pBVar3->Id);
          fwrite("1 1\n",4,1,__s);
          uVar6 = *(uint *)&pBVar3->field_0x8;
          pVVar5 = p->pObjs;
        }
        pBVar3 = (Bbl_Obj_t *)(&pBVar3[1].Id + (uVar6 >> 4));
        if ((Bbl_Obj_t *)(pVVar5->pArray + pVVar5->nSize) <= pBVar3) {
          pBVar3 = (Bbl_Obj_t *)0x0;
        }
      }
      fwrite(".end\n",5,1,__s);
      fclose(__s);
      return;
    }
    if ((*(uint *)&pBVar4->field_0x8 & 1) == 0) {
      if ((*(uint *)&pBVar4->field_0x8 & 2) != 0) {
        uVar6 = pBVar4->Id;
        __format = ".outputs %d\n";
        goto LAB_003ee31b;
      }
      fwrite(".names",6,1,__s);
      if (*(uint *)&pBVar4->field_0x8 < 0x10) {
        pBVar3 = (Bbl_Obj_t *)0x0;
      }
      else {
        pBVar3 = (Bbl_Obj_t *)((long)pBVar4 - (long)pBVar4[1].Id);
      }
      for (; pBVar3 != (Bbl_Obj_t *)0x0; pBVar3 = Bbl_ObjFaninNext(pBVar4,pBVar3)) {
        fprintf(__s," %d",(ulong)(uint)pBVar3->Id);
      }
      fprintf(__s," %d\n",(ulong)(uint)pBVar4->Id);
      fputs(p->pFncs->pArray + (long)pBVar4->Fnc + 4,__s);
    }
    else {
      uVar6 = pBVar4->Id;
      __format = ".inputs %d\n";
LAB_003ee31b:
      fprintf(__s,__format,(ulong)uVar6);
    }
    puVar1 = &pBVar4->field_0x8;
    pBVar2 = pBVar4 + 1;
    pVVar5 = p->pObjs;
    pBVar3 = (Bbl_Obj_t *)pVVar5->pArray;
    pBVar4 = (Bbl_Obj_t *)(&pBVar2->Id + (*(uint *)puVar1 >> 4));
    if ((Bbl_Obj_t *)((long)&pBVar3->Id + (long)pVVar5->nSize) <=
        (Bbl_Obj_t *)(&pBVar2->Id + (*(uint *)puVar1 >> 4))) {
      pBVar4 = (Bbl_Obj_t *)0x0;
    }
  } while( true );
}

Assistant:

void Bbl_ManDumpBlif( Bbl_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Bbl_Obj_t * pObj, * pFanin;
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# Test file written by Bbl_ManDumpBlif() in ABC.\n" );
    fprintf( pFile, ".model %s\n", Bbl_ManName(p) );
    // write objects
    Bbl_ManForEachObj( p, pObj )
    {
        if ( Bbl_ObjIsInput(pObj) )
            fprintf( pFile, ".inputs %d\n", Bbl_ObjId(pObj) );
        else if ( Bbl_ObjIsOutput(pObj) )
            fprintf( pFile, ".outputs %d\n", Bbl_ObjId(pObj) );
        else if ( Bbl_ObjIsLut(pObj) )
        {
            fprintf( pFile, ".names" );
            Bbl_ObjForEachFanin( pObj, pFanin )
                fprintf( pFile, " %d", Bbl_ObjId(pFanin) );
            fprintf( pFile, " %d\n", Bbl_ObjId(pObj) );
            fprintf( pFile, "%s", Bbl_ObjSop(p, pObj) );
        }
        else assert( 0 );
    }
    // write output drivers
    Bbl_ManForEachObj( p, pObj )
    {
        if ( !Bbl_ObjIsOutput(pObj) )
            continue;
        fprintf( pFile, ".names" );
        Bbl_ObjForEachFanin( pObj, pFanin )
            fprintf( pFile, " %d", Bbl_ObjId(pFanin) );
        fprintf( pFile, " %d\n", Bbl_ObjId(pObj) );
        fprintf( pFile, "1 1\n" );
    }
    fprintf( pFile, ".end\n" );
    fclose( pFile );
}